

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

void __thiscall ctemplate::TemplateCache::RefcountedTemplate::IncRef(RefcountedTemplate *this)

{
  int iVar1;
  
  iVar1 = (this->mutex_).mutex_;
  (this->mutex_).mutex_ = iVar1 + -1;
  if (iVar1 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                  ,0xea,"void ctemplate::Mutex::Lock()");
  }
  if (0 < this->refcount_) {
    this->refcount_ = this->refcount_ + 1;
    (this->mutex_).mutex_ = 0;
    return;
  }
  __assert_fail("refcount_ > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_cache.cc"
                ,0x5f,"void ctemplate::TemplateCache::RefcountedTemplate::IncRef()");
}

Assistant:

void IncRef() {
    MutexLock ml(&mutex_);
    assert(refcount_ > 0);
    ++refcount_;
  }